

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O2

int Cba_CommandCec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  Gia_Man_t *p;
  char *pcVar2;
  Cba_Man_t *pCVar3;
  Gia_Man_t *p1;
  Gia_Man_t *pInit;
  int iVar4;
  char *__filename;
  Cec_ParCec_t ParsCec;
  
  pCVar3 = (Cba_Man_t *)pAbc->pAbcCba;
  Cec_ManCecSetDefaultParams(&ParsCec);
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    ParsCec.fVerbose = ParsCec.fVerbose ^ 1;
  }
  if (iVar1 != -1) {
    iVar1 = -2;
    Abc_Print(-2,"usage: :cec [-vh]\n");
    Abc_Print(-2,"\t         combinational equivalence checking\n");
    pcVar2 = "yes";
    if (ParsCec.fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
    pcVar2 = "\t-h     : print the command usage\n";
LAB_0032b11c:
    Abc_Print(iVar1,pcVar2);
    return 1;
  }
  if (pCVar3 != (Cba_Man_t *)0x0) {
    if (argc - globalUtilOptind == 1) {
      pcVar2 = argv[globalUtilOptind];
      __filename = pcVar2;
    }
    else {
      pcVar2 = pCVar3->pSpec;
      __filename = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "File name is not given on the command line.\n";
        iVar1 = -1;
        goto LAB_0032b11c;
      }
    }
    do {
      if (*pcVar2 == '>') {
        *pcVar2 = '\\';
      }
      else if (*pcVar2 == '\0') goto LAB_0032b161;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  pcVar2 = "Cba_CommandCec(): There is no current design.\n";
  iVar1 = 1;
LAB_0032b310:
  iVar4 = 0;
LAB_0032b311:
  Abc_Print(iVar1,pcVar2);
  return iVar4;
LAB_0032b161:
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
    pcVar2 = Extra_FileGetSimilarName(__filename,".v",".blif",(char *)0x0,(char *)0x0,(char *)0x0);
    if (pcVar2 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
    }
    pcVar2 = "\n";
    iVar1 = 1;
    iVar4 = iVar1;
    goto LAB_0032b311;
  }
  fclose(__stream);
  p = Cba_ManBlast(pCVar3,0,0,0);
  if (p == (Gia_Man_t *)0x0) {
    pcVar2 = "Extracting AIG from the current design has failed.\n";
  }
  else {
    pcVar2 = Extra_FileNameExtension(__filename);
    iVar1 = strcmp(pcVar2,"blif");
    if (iVar1 == 0) {
      pCVar3 = Cba_ManReadBlif(__filename);
    }
    else {
      pcVar2 = Extra_FileNameExtension(__filename);
      if ((*pcVar2 == 'v') && (pcVar2[1] == '\0')) {
        pCVar3 = Cba_ManReadVerilog(__filename);
      }
      else {
        pcVar2 = Extra_FileNameExtension(__filename);
        iVar1 = strcmp(pcVar2,"cba");
        if (iVar1 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaCom.c"
                        ,0x289,"int Cba_CommandCec(Abc_Frame_t *, int, char **)");
        }
        pCVar3 = Cba_ManReadCba(__filename);
      }
    }
    p1 = Cba_ManBlast(pCVar3,0,0,0);
    Cba_ManFree(pCVar3);
    if (p1 != (Gia_Man_t *)0x0) {
      pInit = Gia_ManMiter(p,p1,0,1,0,0,ParsCec.fVerbose);
      if (pInit != (Gia_Man_t *)0x0) {
        iVar1 = Cec_ManVerify(pInit,&ParsCec);
        pAbc->Status = iVar1;
        Gia_ManStop(pInit);
      }
      Gia_ManStop(p);
      Gia_ManStop(p1);
      return 0;
    }
    Gia_ManStop(p);
    pcVar2 = "Extracting AIG from the original design has failed.\n";
  }
  iVar1 = -1;
  goto LAB_0032b310;
}

Assistant:

int Cba_CommandCec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc), * pTemp;
    Gia_Man_t * pFirst, * pSecond, * pMiter;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    char * pFileName, * pStr, ** pArgvNew;
    int c, nArgcNew, fDumpMiter = 0;
    FILE * pFile;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandCec(): There is no current design.\n" );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( p->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        pFileName = p->pSpec;
    }
    else
        pFileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pStr = pFileName; *pStr; pStr++ )
        if ( *pStr == '>' )
            *pStr = '\\';
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".blif", NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    // extract AIG from the current design
    pFirst = Cba_ManBlast( p, 0, 0, 0 );
    if ( pFirst == NULL )
    {
        Abc_Print( -1, "Extracting AIG from the current design has failed.\n" );
        return 0;
    }
    // extract AIG from the second design

    if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
        pTemp = Cba_ManReadBlif( pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
        pTemp = Cba_ManReadVerilog( pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "cba" )  )
        pTemp = Cba_ManReadCba( pFileName );
    else assert( 0 );
    pSecond = Cba_ManBlast( pTemp, 0, 0, 0 );
    Cba_ManFree( pTemp );
    if ( pSecond == NULL )
    {
        Gia_ManStop( pFirst );
        Abc_Print( -1, "Extracting AIG from the original design has failed.\n" );
        return 0;
    }
    // compute the miter
    pMiter = Gia_ManMiter( pFirst, pSecond, 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        //Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pMiter );
    }
    Gia_ManStop( pFirst );
    Gia_ManStop( pSecond );
    return 0;
usage:
    Abc_Print( -2, "usage: :cec [-vh]\n" );
    Abc_Print( -2, "\t         combinational equivalence checking\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}